

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,
          uint32_t heightIn,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,
          uint32_t heightOut)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  AreaInfo *this_00;
  uint *puVar4;
  AreaInfo *info;
  pointer this_01;
  AbstractTaskProvider *in_RDI;
  uint32_t in_stack_00000008;
  uint32_t in_stack_ffffffffffffff3c;
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  *in_stack_ffffffffffffff40;
  Image *in_stack_ffffffffffffff48;
  InputImageInfo *in_stack_ffffffffffffff50;
  OutputImageInfo *this_02;
  undefined8 in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t uVar5;
  uint width_;
  uint32_t y;
  uint x;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff60,(uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff58,
             (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff50);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff60,(uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff58,
             (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff50);
  uVar5 = (uint32_t)in_stack_ffffffffffffff60;
  bVar1 = AbstractTaskProvider::_ready(in_RDI);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException
              ((imageException *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  this_00 = (AreaInfo *)operator_new(0x68);
  puVar4 = std::min<unsigned_int>((uint *)&stack0xffffffffffffffe4,(uint *)&stack0x00000020);
  x = *puVar4;
  info = (AreaInfo *)
         std::min<unsigned_int>((uint *)&stack0xffffffffffffffe0,(uint *)&stack0x00000028);
  width_ = *(uint *)&(info->startX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  uVar2 = anon_unknown.dwarf_313e4::threadCount();
  y = uVar2;
  InputImageInfo::InputImageInfo
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (uint32_t)((ulong)in_stack_ffffffffffffff40 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,uVar2,uVar5);
  this_02 = (OutputImageInfo *)&stack0xffffffffffffffc8;
  std::unique_ptr<Function_Pool::InputImageInfo,std::default_delete<Function_Pool::InputImageInfo>>
  ::unique_ptr<std::default_delete<Function_Pool::InputImageInfo>,void>
            (in_stack_ffffffffffffff40,(pointer)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator=(in_stack_ffffffffffffff40,
            (unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr(in_stack_ffffffffffffff40);
  operator_new(0x68);
  uVar2 = anon_unknown.dwarf_313e4::threadCount();
  uVar5 = uVar2;
  OutputImageInfo::OutputImageInfo
            (this_02,in_stack_ffffffffffffff48,(uint32_t)((ulong)in_stack_ffffffffffffff40 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,uVar2,in_stack_00000008);
  std::
  unique_ptr<Function_Pool::OutputImageInfo,std::default_delete<Function_Pool::OutputImageInfo>>::
  unique_ptr<std::default_delete<Function_Pool::OutputImageInfo>,void>
            ((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
              *)in_stack_ffffffffffffff40,(pointer)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  std::
  unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>::
  operator=((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             *)in_stack_ffffffffffffff40,
            (unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             *)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  std::
  unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
               *)in_stack_ffffffffffffff40);
  this_01 = std::
            unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
            ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                          *)0x12e63f);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator*((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)this_01);
  AreaInfo::_copy(this_00,info,x,y,width_,uVar5);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)0x12e697);
  std::
  unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>::
  operator*((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             *)this_01);
  AreaInfo::_copy(this_00,info,x,y,width_,uVar5);
  return;
}

Assistant:

void FunctionPoolTask::_setup( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                                   Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        Image_Function::ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        Image_Function::ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in, startXIn, startYIn, std::min( widthIn, widthOut ),
                                                                                                     std::min( heightIn, heightOut ), threadCount() ) );
        _infoOut = std::unique_ptr < OutputImageInfo >( new OutputImageInfo( out, startXOut, startYOut, widthOut, heightOut, threadCount() ) );

        _infoOut->_copy( *_infoIn1, startXOut, startYOut, widthOut, heightOut );
        _infoIn1->_copy( *_infoOut, startXIn, startYIn, widthIn, heightIn );
    }